

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O3

void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)

{
  int iVar1;
  char cVar2;
  int iVar3;
  void *__s;
  void *pvVar4;
  int iVar5;
  
  if (0 < self->indentWidth) {
    iVar1 = self->currentIndent;
    iVar3 = adt_bytearray_length(self->indentArray);
    iVar5 = self->currentIndent + self->indentWidth;
    self->currentIndent = iVar5;
    if (iVar3 < iVar5) {
      cVar2 = adt_bytearray_resize(self->indentArray,iVar5 + 1);
      if (cVar2 != '\0') {
        return;
      }
      __s = (void *)adt_bytearray_data(self->indentArray);
      if (__s == (void *)0x0) {
        __assert_fail("data != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                      ,0xf2,"void dtl_json_writer_growIndentArray(dtl_json_writer_t *)");
      }
      iVar1 = self->currentIndent;
      pvVar4 = __s;
    }
    else {
      pvVar4 = (void *)adt_bytearray_data(self->indentArray);
      __s = (void *)((long)iVar1 + (long)pvVar4);
      iVar1 = self->indentWidth;
    }
    memset(__s,0x20,(long)iVar1);
    *(undefined1 *)((long)pvVar4 + (long)self->currentIndent) = 0;
  }
  return;
}

Assistant:

static void dtl_json_writer_increaseIndent(dtl_json_writer_t *self)
{
   if (self->indentWidth > 0)
   {
      int32_t oldIndent = self->currentIndent;
      int32_t currentLen = adt_bytearray_length(self->indentArray);
      self->currentIndent+=self->indentWidth;
      if (currentLen < self->currentIndent)
      {
         dtl_json_writer_growIndentArray(self);
      }
      else
      {
         uint8_t *data = adt_bytearray_data(self->indentArray);
         memset(&data[oldIndent], m_indentChar, self->indentWidth);
         data[self->currentIndent] = 0u;
      }
   }
}